

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O2

void __thiscall wabt::TypeEntry::~TypeEntry(TypeEntry *this)

{
  this->_vptr_TypeEntry = (_func_int **)&PTR__TypeEntry_00233e20;
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

virtual ~TypeEntry() = default;